

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O0

int Msat_ClausePropagate(Msat_Clause_t *pC,Msat_Lit_t Lit,int *pAssigns,Msat_Lit_t *pLit_out)

{
  uint uVar1;
  int local_38;
  int i;
  Msat_Lit_t LitF;
  Msat_Lit_t *pLit_out_local;
  int *pAssigns_local;
  Msat_Lit_t Lit_local;
  Msat_Clause_t *pC_local;
  
  uVar1 = Lit ^ 1;
  if (pC[1].Num == uVar1) {
    pC[1].Num = *(int *)&pC[1].field_0x4;
    *(uint *)&pC[1].field_0x4 = uVar1;
  }
  if (*(uint *)&pC[1].field_0x4 == uVar1) {
    if (pAssigns[pC[1].Num >> 1] == pC[1].Num) {
      pC_local._4_4_ = 1;
    }
    else {
      if (2 < (*(uint *)&pC->field_0x4 >> 3 & 0x3fff)) {
        for (local_38 = 2; local_38 < (int)(*(uint *)&pC->field_0x4 >> 3 & 0x3fff);
            local_38 = local_38 + 1) {
          if (pAssigns[(&pC[1].Num)[local_38] >> 1] != ((&pC[1].Num)[local_38] ^ 1U)) {
            *(int *)&pC[1].field_0x4 = (&pC[1].Num)[local_38];
            (&pC[1].Num)[local_38] = uVar1;
            *pLit_out = *(uint *)&pC[1].field_0x4 ^ 1;
            return 1;
          }
        }
      }
      *pLit_out = pC[1].Num;
      pC_local._4_4_ = 0;
    }
    return pC_local._4_4_;
  }
  __assert_fail("pC->pData[1] == LitF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatClause.c"
                ,0x155,"int Msat_ClausePropagate(Msat_Clause_t *, Msat_Lit_t, int *, Msat_Lit_t *)")
  ;
}

Assistant:

int  Msat_ClausePropagate( Msat_Clause_t * pC, Msat_Lit_t Lit, int * pAssigns, Msat_Lit_t * pLit_out )
{
    // make sure the false literal is pC->pData[1]
    Msat_Lit_t LitF = MSAT_LITNOT(Lit);
    if ( pC->pData[0] == LitF )
         pC->pData[0] = pC->pData[1], pC->pData[1] = LitF;
    assert( pC->pData[1] == LitF );
    // if the 0-th watch is true, clause is already satisfied
    if ( pAssigns[MSAT_LIT2VAR(pC->pData[0])] == pC->pData[0] )
        return 1; 
    // look for a new watch
    if ( pC->nSize > 2 )
    {
        int i;
        for ( i = 2; i < (int)pC->nSize; i++ )
            if ( pAssigns[MSAT_LIT2VAR(pC->pData[i])] != MSAT_LITNOT(pC->pData[i]) )
            {
                pC->pData[1] = pC->pData[i], pC->pData[i] = LitF;
                *pLit_out = MSAT_LITNOT(pC->pData[1]);
                return 1; 
            }
    }
    // clause is unit under assignment
    *pLit_out = pC->pData[0];
    return 0;
}